

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_wString ON_SubDHashTypeToString(ON_SubDHashType subd_hash_type,bool bVerbose)

{
  char in_DL;
  undefined7 in_register_00000039;
  ON_wString *this;
  wchar_t *s;
  ON_wString local_20;
  ON_wString local_18;
  
  this = (ON_wString *)CONCAT71(in_register_00000039,subd_hash_type);
  if (bVerbose < 4) {
    s = (wchar_t *)(&DAT_006ce658 + *(int *)(&DAT_006ce658 + (ulong)bVerbose * 4));
  }
  else {
    s = L"invalid";
  }
  if (in_DL == '\0') {
    ON_wString::ON_wString(this,s);
  }
  else {
    ON_wString::ON_wString(&local_18,L"ON_SubDHashType::");
    ON_wString::ON_wString(&local_20,s);
    ON_wString::operator+(this,&local_18);
    ON_wString::~ON_wString(&local_20);
    ON_wString::~ON_wString(&local_18);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDHashTypeToString(
  ON_SubDHashType subd_hash_type,
  bool bVerbose
)
{
  const wchar_t* name;
  switch (subd_hash_type)
  {
  case ON_SubDHashType::Unset:
    name = L"Unset";
    break;
  case ON_SubDHashType::Topology:
    name = L"Topology";
    break;
  case ON_SubDHashType::TopologyAndEdgeCreases:
    name = L"TopologyAndEdgeCreases";
    break;
  case ON_SubDHashType::Geometry:
    name = L"Geometry";
    break;
  default:
    name = L"invalid";
    break;
  }

  return bVerbose ? (ON_wString(L"ON_SubDHashType::") + ON_wString(name)) : ON_wString(name);
}